

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O2

Byte * __thiscall
CharStringType2Interpreter::InterpretOr
          (CharStringType2Interpreter *this,Byte *inProgramCounter,LongFilePositionType inReadLimit)

{
  _List_node_base *p_Var1;
  int iVar2;
  Trace *this_00;
  _List_node_base *p_Var3;
  _List_node_base *local_38;
  CharStringOperand newOperand;
  
  iVar2 = (*this->mImplementationHelper->_vptr_IType2InterpreterImplementation[0x1c])
                    (this->mImplementationHelper,this);
  if (iVar2 == 0) {
    newOperand.IsInteger = true;
    if ((this->mOperandStack).
        super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
        _M_size < 2) {
      this_00 = Trace::DefaultTrace();
      inProgramCounter = (Byte *)0x0;
      Trace::TraceToLog(this_00,
                        "CharStringType2Interpreter::InterpretOr, or should have at least 2 arguments on stack. got %d. aborting"
                        ,(this->mOperandStack).
                         super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>.
                         _M_impl._M_node._M_size);
    }
    else {
      p_Var3 = (this->mOperandStack).
               super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
               _M_node.super__List_node_base._M_prev;
      local_38 = p_Var3[1]._M_prev;
      if (((ulong)p_Var3[1]._M_next & 1) != 0) {
        local_38 = (_List_node_base *)(double)(long)local_38;
      }
      std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::pop_back
                (&this->mOperandStack);
      p_Var3 = (this->mOperandStack).
               super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
               _M_node.super__List_node_base._M_prev;
      p_Var1 = p_Var3[1]._M_next;
      p_Var3 = p_Var3[1]._M_prev;
      std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::pop_back
                (&this->mOperandStack);
      if (((double)local_38 != 0.0) || (NAN((double)local_38))) {
        newOperand.field_1.IntegerValue = 1;
      }
      else {
        if (((ulong)p_Var1 & 1) != 0) {
          p_Var3 = (_List_node_base *)(double)(long)p_Var3;
        }
        newOperand.field_1._0_4_ = -(uint)((double)p_Var3 != 0.0) & 1;
        newOperand.field_1.IntegerValue._4_4_ = 0;
      }
      std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::push_back
                (&this->mOperandStack,&newOperand);
    }
  }
  else {
    inProgramCounter = (Byte *)0x0;
  }
  return inProgramCounter;
}

Assistant:

Byte* CharStringType2Interpreter::InterpretOr(Byte* inProgramCounter, LongFilePositionType inReadLimit)
{
	EStatusCode status = mImplementationHelper->Type2Or(mOperandStack);
	if(status != eSuccess)
		return NULL;

	CharStringOperand valueA;
	CharStringOperand valueB;
	CharStringOperand newOperand;
	newOperand.IsInteger = true;

	if(mOperandStack.size() < 2) {
		TRACE_LOG1("CharStringType2Interpreter::InterpretOr, or should have at least 2 arguments on stack. got %d. aborting", mOperandStack.size());
		return NULL;
	}


	valueB = mOperandStack.back();
	mOperandStack.pop_back();
	valueA = mOperandStack.back();
	mOperandStack.pop_back();

	newOperand.IntegerValue = (
		(valueB.IsInteger ? valueB.IntegerValue : valueB.RealValue) ||
		(valueA.IsInteger ? valueA.IntegerValue : valueA.RealValue)
		) ? 1:0;	mOperandStack.push_back(newOperand);
	return inProgramCounter;
}